

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>::ModeState
          (ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *this)

{
  long in_RDI;
  
  vector<duckdb::FrameBounds,_true>::vector((vector<duckdb::FrameBounds,_true> *)0xb2062f);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined1 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  duckdb::DataChunk::DataChunk((DataChunk *)(in_RDI + 0x50));
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  return;
}

Assistant:

ModeState() {
	}